

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O0

void __thiscall cmFileTimeComparison::cmFileTimeComparison(cmFileTimeComparison *this)

{
  cmFileTimeComparisonInternal *this_00;
  cmFileTimeComparison *this_local;
  
  this_00 = (cmFileTimeComparisonInternal *)operator_new(0x38);
  cmFileTimeComparisonInternal::cmFileTimeComparisonInternal(this_00);
  this->Internals = this_00;
  return;
}

Assistant:

cmFileTimeComparison::cmFileTimeComparison()
{
  this->Internals = new cmFileTimeComparisonInternal;
}